

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
chaiscript::dispatch::detail::
call_func<chaiscript::dispatch::detail::Fun_Caller<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&>,std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&,0ul,1ul>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_1,
          undefined8 param_2,
          Fun_Caller<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *param_3,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                   *param_4)

{
  Type_Conversions_State *in_stack_000000c0;
  Boxed_Value *in_stack_000000c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inner;
  
  inner = param_1;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_4,0);
  boxed_cast<std::__cxx11::string_const&>(in_stack_000000c8,in_stack_000000c0);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_4,1);
  boxed_cast<std::__cxx11::string_const&>(in_stack_000000c8,in_stack_000000c0);
  Fun_Caller<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&>::
  operator()(param_3,inner,in_stack_ffffffffffffffa8);
  return param_1;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }